

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printSeq(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  Ref local_28;
  Ref node_local;
  
  local_28.inst = node.inst;
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
  printChild(this,(Value *)*puVar1,local_28,-1);
  emit(this,',');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
  printChild(this,(Value *)*puVar1,local_28,1);
  return;
}

Assistant:

void printSeq(Ref node) {
    printChild(node[1], node, -1);
    emit(',');
    space();
    printChild(node[2], node, 1);
  }